

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGroupGet
          (zet_device_handle_t hDevice,uint32_t *pCount,zet_metric_group_handle_t *phMetricGroups)

{
  zet_metric_group_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  zet_pfnMetricGroupGet_t pfnGet;
  ze_result_t result;
  zet_metric_group_handle_t *phMetricGroups_local;
  uint32_t *pCount_local;
  zet_device_handle_t hDevice_local;
  
  pfnGet._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c888 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phMetricGroups != (zet_metric_group_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (zet_metric_group_handle_t)context_t::get((context_t *)&context);
      phMetricGroups[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnGet._4_4_ = (*DAT_0011c888)(hDevice,pCount,phMetricGroups);
  }
  return pfnGet._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupGet(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t* pCount,                               ///< [in,out] pointer to the number of metric groups.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of metric groups available.
                                                        ///< if count is greater than the number of metric groups available, then
                                                        ///< the driver shall update the value with the correct number of metric
                                                        ///< groups available.
        zet_metric_group_handle_t* phMetricGroups       ///< [in,out][optional][range(0, *pCount)] array of handle of metric groups.
                                                        ///< if count is less than the number of metric groups available, then
                                                        ///< driver shall only retrieve that number of metric groups.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGet = context.zetDdiTable.MetricGroup.pfnGet;
        if( nullptr != pfnGet )
        {
            result = pfnGet( hDevice, pCount, phMetricGroups );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phMetricGroups ) && ( i < *pCount ); ++i )
                phMetricGroups[ i ] = reinterpret_cast<zet_metric_group_handle_t>( context.get() );

        }

        return result;
    }